

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aabb.h
# Opt level: O1

void __thiscall aabb::aabb(aabb *this,point3 *a,point3 *b)

{
  double dVar1;
  double dVar2;
  double dVar3;
  
  (this->x).min = INFINITY;
  (this->x).max = -INFINITY;
  (this->y).min = INFINITY;
  (this->y).max = -INFINITY;
  (this->z).min = INFINITY;
  (this->z).max = -INFINITY;
  dVar1 = a->e[0];
  dVar2 = b->e[0];
  dVar3 = dVar2;
  if (dVar1 <= dVar2) {
    dVar3 = dVar1;
  }
  (this->x).min = dVar3;
  (this->x).max =
       (double)(~-(ulong)(dVar2 < dVar1) & (ulong)dVar2 | -(ulong)(dVar2 < dVar1) & (ulong)dVar1);
  dVar1 = a->e[1];
  dVar2 = b->e[1];
  dVar3 = dVar2;
  if (dVar1 <= dVar2) {
    dVar3 = dVar1;
  }
  (this->y).min = dVar3;
  (this->y).max =
       (double)(~-(ulong)(dVar2 < dVar1) & (ulong)dVar2 | -(ulong)(dVar2 < dVar1) & (ulong)dVar1);
  dVar1 = a->e[2];
  dVar2 = b->e[2];
  dVar3 = dVar2;
  if (dVar1 <= dVar2) {
    dVar3 = dVar1;
  }
  (this->z).min = dVar3;
  (this->z).max =
       (double)(~-(ulong)(dVar2 < dVar1) & (ulong)dVar2 | -(ulong)(dVar2 < dVar1) & (ulong)dVar1);
  pad_to_minimums(this);
  return;
}

Assistant:

aabb(const point3& a, const point3& b) {
        // Treat the two points a and b as extrema for the bounding box, so we don't require a
        // particular minimum/maximum coordinate order.

        x = (a[0] <= b[0]) ? interval(a[0], b[0]) : interval(b[0], a[0]);
        y = (a[1] <= b[1]) ? interval(a[1], b[1]) : interval(b[1], a[1]);
        z = (a[2] <= b[2]) ? interval(a[2], b[2]) : interval(b[2], a[2]);

        pad_to_minimums();
    }